

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O1

void Gia_ManPrintSignals(Gia_Man_t *p,int *pFreq,char *pStr)

{
  bool bVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  if ((long)p->nObjs < 1) {
    uVar7 = 0;
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    uVar3 = 0;
    uVar7 = 0;
    do {
      iVar6 = pFreq[lVar5];
      bVar1 = 1 < iVar6;
      if (iVar6 < 2) {
        iVar6 = 0;
      }
      uVar7 = (ulong)((int)uVar7 + (uint)bVar1);
      uVar3 = (ulong)(uint)((int)uVar3 + iVar6);
      lVar5 = lVar5 + 1;
    } while (p->nObjs != lVar5);
  }
  printf("%s (total = %d  driven = %d)\n",pStr,uVar7,uVar3);
  uVar3 = (ulong)(uint)p->nObjs;
  if (0 < p->nObjs) {
    uVar7 = 0;
    uVar4 = 0;
    do {
      if (10 < pFreq[uVar7]) {
        if ((long)(int)uVar3 <= (long)uVar7) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar4 = uVar4 + 1;
        printf("%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n",(ulong)uVar4,uVar7 & 0xffffffff,
               (ulong)(uint)p->pRefs[uVar7]);
        Vec_IntPush(p_00,(int)uVar7);
      }
      uVar7 = uVar7 + 1;
      uVar3 = (ulong)p->nObjs;
    } while ((long)uVar7 < (long)uVar3);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManPrintSignals( Gia_Man_t * p, int * pFreq, char * pStr )
{
    Vec_Int_t * vObjs;
    int i, Counter = 0, nTotal = 0;
    vObjs = Vec_IntAlloc( 100 );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 1 )
        {
            nTotal += pFreq[i];
            Counter++;
        }
    printf( "%s (total = %d  driven = %d)\n", pStr, Counter, nTotal );
    Counter = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        if ( pFreq[i] > 10 )
        {
            printf( "%3d :   Obj = %6d   Refs = %6d   Freq = %6d\n", 
                ++Counter, i, Gia_ObjRefNum(p, Gia_ManObj(p,i)), pFreq[i] );
            Vec_IntPush( vObjs, i );
        }
    Vec_IntFree( vObjs );
}